

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rasterizing.cpp
# Opt level: O3

void rasterizeTriangle(Vec3f *points,Vec3f *norms,Vec2f *text,
                      vector<Vec3<float>,_std::allocator<Vec3<float>_>_> *framebuffer,
                      vector<float,_std::allocator<float>_> *zBuffer)

{
  undefined8 uVar1;
  float fVar2;
  int y;
  int x;
  bool bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  Vec3f local_c4;
  undefined8 local_b8;
  undefined8 uStack_b0;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  float local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  undefined1 local_68 [16];
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  uVar1._0_4_ = points->x;
  uVar1._4_4_ = points->y;
  fVar9 = points[1].x;
  fVar10 = points[2].x;
  fVar20 = fVar10;
  if (fVar9 <= fVar10) {
    fVar20 = fVar9;
  }
  if ((float)(undefined4)uVar1 <= fVar20) {
    fVar20 = (float)(undefined4)uVar1;
  }
  fVar2 = fVar10;
  if (fVar10 <= fVar9) {
    fVar2 = fVar9;
  }
  uStack_b0 = 0;
  if (fVar2 <= (float)(undefined4)uVar1) {
    fVar2 = (float)(undefined4)uVar1;
  }
  if ((int)fVar20 <= (int)fVar2) {
    fVar8 = points[1].y;
    fVar15 = points[2].y;
    fVar10 = fVar10 - (float)(undefined4)uVar1;
    fVar11 = fVar8 - uVar1._4_4_;
    fVar12 = 0.0;
    fVar13 = 0.0;
    fVar7 = fVar15;
    if (fVar8 <= fVar15) {
      fVar7 = fVar8;
    }
    if (uVar1._4_4_ <= fVar7) {
      fVar7 = uVar1._4_4_;
    }
    fVar6 = fVar15;
    if (fVar15 <= fVar8) {
      fVar6 = fVar8;
    }
    if (fVar6 <= uVar1._4_4_) {
      fVar6 = uVar1._4_4_;
    }
    fVar15 = fVar15 - uVar1._4_4_;
    fVar8 = -(fVar9 - (float)(undefined4)uVar1);
    fVar9 = (fVar9 - (float)(undefined4)uVar1) * fVar15 - fVar11 * fVar10;
    local_68 = ZEXT416((uint)fVar9);
    local_88 = uVar1._4_4_;
    fStack_84 = uVar1._4_4_;
    fStack_80 = uVar1._4_4_;
    fStack_7c = uVar1._4_4_;
    uStack_94 = 0x80000000;
    uStack_90 = 0x80000000;
    uStack_8c = 0x80000000;
    fVar14 = uVar1._4_4_;
    fVar16 = fVar9;
    fVar17 = fVar9;
    fVar18 = fVar9;
    fVar19 = fVar9;
    x = (int)fVar20;
    local_b8 = uVar1;
    local_a8 = fVar9;
    fStack_a4 = fVar9;
    fStack_a0 = fVar9;
    fStack_9c = fVar9;
    local_98 = fVar8;
    local_78 = fVar10;
    fStack_74 = fVar11;
    fStack_70 = fVar12;
    fStack_6c = fVar13;
    do {
      if ((int)fVar7 <= (int)fVar6) {
        fVar20 = (float)local_b8 - (float)x;
        fStack_54 = -local_b8._4_4_;
        fVar23 = -(float)uStack_b0;
        fVar24 = -uStack_b0._4_4_;
        fVar22 = -fVar20 * fVar15;
        fStack_44 = local_b8._4_4_;
        fStack_40 = (float)uStack_b0;
        fStack_3c = uStack_b0._4_4_;
        fVar21 = local_b8._4_4_;
        y = (int)fVar7;
        local_58 = fVar22;
        fStack_50 = fVar23;
        fStack_4c = fVar24;
        local_48 = fVar20;
        do {
          auVar4._0_4_ = (uVar1._4_4_ - (float)y) * fVar10 + fVar22;
          auVar4._4_4_ = fVar20 * fVar11 + (uVar1._4_4_ - (float)y) * fVar8;
          auVar4._8_4_ = fVar14 * fVar12 + fVar23;
          auVar4._12_4_ = fVar21 * fVar13 + fVar24;
          local_c4.x = 1.0 - (auVar4._4_4_ + auVar4._0_4_) / fVar9;
          auVar5._4_4_ = fVar17;
          auVar5._0_4_ = fVar16;
          auVar5._8_4_ = fVar18;
          auVar5._12_4_ = fVar19;
          auVar5 = divps(auVar4,auVar5);
          local_c4._4_8_ = auVar5._0_8_;
          if (((0.0 < auVar5._4_4_) && (0.0 < auVar5._0_4_)) && (0.0 < local_c4.x)) {
            updateZBuffer(x,y,points,text,norms,&local_c4,framebuffer,zBuffer);
            fVar8 = local_98;
            fVar9 = (float)local_68._0_4_;
            fVar10 = local_78;
            fVar11 = fStack_74;
            fVar12 = fStack_70;
            fVar13 = fStack_6c;
            uVar1._4_4_ = local_88;
            fVar14 = fStack_84;
            fVar16 = local_a8;
            fVar17 = fStack_a4;
            fVar18 = fStack_a0;
            fVar19 = fStack_9c;
            fVar20 = local_48;
            fVar21 = fStack_44;
            fVar22 = local_58;
            fVar23 = fStack_50;
            fVar24 = fStack_4c;
          }
          y = y + 1;
        } while ((int)fVar6 + 1 != y);
      }
      bVar3 = x != (int)fVar2;
      x = x + 1;
    } while (bVar3);
  }
  return;
}

Assistant:

void rasterizeTriangle(Vec3f points[], const Vec3f norms[], Vec2f text[], std::vector<Vec3f> &framebuffer,
                       std::vector<float> &zBuffer) {
    Vec3f A, B, C, P, AB, AC, PA, barycenter;
    int minX, maxX, minY, maxY;

    A = points[0];
    B = points[1];
    C = points[2];

    AB = Vec3f(
        B.x - A.x,
        B.y - A.y,
        B.z - A.z
    );

    AC = Vec3f(
            C.x - A.x,
            C.y - A.y,
            C.z - A.z
    );

    // finding bounding box
    minX = std::min(A.x, std::min(B.x, C.x));
    maxX = std::max(A.x, std::max(B.x, C.x));
    minY = std::min(A.y, std::min(B.y, C.y));
    maxY = std::max(A.y, std::max(B.y, C.y));

    // iterating on bounding box
    for(int x = minX; x <= maxX; x++){
        for(int y = minY; y <= maxY; y++){
            P = Vec3f(x, y, 1);
            PA = Vec3f(
                    A.x - P.x,
                    A.y - P.y,
                    A.z - P.z
            );
            barycenter = getBarycentricCoordinates(AB, AC, PA);
            // checking if inside triangle and update z-buffer
            if(barycenter.x > 0 && barycenter.y > 0 && barycenter.z > 0){
                updateZBuffer(x, y, points, text, norms, barycenter, framebuffer, zBuffer);
            }
        }
    }
}